

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O2

int pt_qry_sync_backward(pt_query_decoder *decoder,uint64_t *ip)

{
  uint8_t *puVar1;
  int iVar2;
  uint8_t *puVar3;
  pt_config *config;
  uint8_t *puVar4;
  
  if (decoder == (pt_query_decoder *)0x0) {
    return -2;
  }
  puVar3 = (decoder->evdec).pacdec.pos;
  puVar4 = puVar3;
  if ((puVar3 == (uint8_t *)0x0) &&
     (puVar3 = (decoder->evdec).pacdec.config.end, puVar4 = puVar3, puVar3 == (uint8_t *)0x0)) {
    iVar2 = -10;
  }
  else {
    do {
      while( true ) {
        pt_qry_reset(decoder);
        do {
          iVar2 = pt_evt_sync_backward(&decoder->evdec);
          if (iVar2 < 0) {
            return iVar2;
          }
          puVar1 = (decoder->evdec).pacdec.pos;
        } while (puVar3 <= puVar1);
        iVar2 = pt_qry_start(decoder,ip);
        puVar3 = puVar1;
        if (iVar2 < 0) break;
        if ((decoder->evdec).pacdec.pos < puVar4) {
          return 0;
        }
      }
    } while (iVar2 == -7);
  }
  return iVar2;
}

Assistant:

int pt_qry_sync_backward(struct pt_query_decoder *decoder, uint64_t *ip)
{
	const uint8_t *start, *sync, *pos;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	start = pt_qry_pos(decoder);
	if (!start) {
		const struct pt_config *config;

		config = pt_qry_config(decoder);
		if (!config)
			return -pte_internal;

		start = config->end;
		if (!start)
			return -pte_bad_config;
	}

	sync = start;
	for (;;) {
		errcode = pt_qry_reset(decoder);
		if (errcode < 0)
			return errcode;

		do {
			errcode = pt_evt_sync_backward(&decoder->evdec);
			if (errcode < 0)
				return errcode;

			pos = pt_qry_pos(decoder);
		} while (sync <= pos);

		sync = pos;

		errcode = pt_qry_start(decoder, ip);
		if (errcode < 0) {
			/* Ignore incomplete trace segments at the end.  We
			 * need a full PSB+ to start decoding.
			 */
			if (errcode != -pte_eos)
				return errcode;

			continue;
		}

		/* When starting inside or right after PSB+, we may end up at
		 * the same PSB again.  Skip it.
		 */
		pos = pt_qry_pos(decoder);
		if (pos < start)
			break;
	}

	return 0;
}